

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

bool __thiscall
Centaurus::CharClass<unsigned_char>::overlaps
          (CharClass<unsigned_char> *this,CharClass<unsigned_char> *cc)

{
  bool bVar1;
  reference pRVar2;
  reference pRVar3;
  bool local_59;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_40;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_38;
  __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
  local_30;
  const_iterator j;
  const_iterator i;
  CharClass<unsigned_char> *cc_local;
  CharClass<unsigned_char> *this_local;
  
  j = std::
      vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
      cbegin(&this->m_ranges);
  local_30._M_current =
       (Range<unsigned_char> *)
       std::
       vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
       cbegin(&cc->m_ranges);
  while( true ) {
    local_38._M_current =
         (Range<unsigned_char> *)
         std::
         vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
         ::cend(&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&j,&local_38);
    local_59 = false;
    if (bVar1) {
      local_40._M_current =
           (Range<unsigned_char> *)
           std::
           vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>
           ::cend(&cc->m_ranges);
      local_59 = __gnu_cxx::operator!=(&local_30,&local_40);
    }
    if (local_59 == false) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator*(&j);
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
             ::operator*(&local_30);
    bVar1 = Range<unsigned_char>::operator<(pRVar2,pRVar3);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
      ::operator++(&j,0);
    }
    else {
      pRVar2 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator*(&local_30);
      pRVar3 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
               ::operator*(&j);
      bVar1 = Range<unsigned_char>::operator<(pRVar2,pRVar3);
      if (!bVar1) {
        return true;
      }
      __gnu_cxx::
      __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
      ::operator++(&local_30,0);
    }
  }
  return false;
}

Assistant:

bool overlaps(const CharClass<TCHAR>& cc) const
    {
        auto i = m_ranges.cbegin();
        auto j = cc.m_ranges.cbegin();

        while (i != m_ranges.cend() && j != cc.m_ranges.cend())
        {
            if (*i < *j)
            {
                i++;
            }
            else if (*j < *i)
            {
                j++;
            }
            else
            {
                return true;
            }
        }
        return false;
    }